

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Integrate.cpp
# Opt level: O3

void __thiscall
chrono::ChFunction_Integrate::ChFunction_Integrate
          (ChFunction_Integrate *this,ChFunction_Integrate *other)

{
  double *pdVar1;
  double *pdVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  double *pdVar3;
  ulong rows;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  int iVar13;
  undefined4 extraout_var;
  Index index;
  ulong uVar14;
  long lVar15;
  Index size;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  (this->super_ChFunction)._vptr_ChFunction = (_func_int **)&PTR__ChFunction_Integrate_00b448e0;
  (this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  iVar13 = (*((other->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->_vptr_ChFunction[2])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            (a_Stack_30,(ChFunction *)CONCAT44(extraout_var,iVar13));
  _Var12._M_pi = a_Stack_30[0]._M_pi;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ChFunction *)CONCAT44(extraout_var,iVar13);
  (this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var12._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
    }
  }
  this->order = other->order;
  dVar5 = other->x_start;
  this->C_start = other->C_start;
  this->x_start = dVar5;
  this->x_end = other->x_end;
  this->num_samples = other->num_samples;
  pdVar3 = (other->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  rows = (other->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows;
  if ((this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != rows) {
    Eigen::PlainObjectBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>,rows,1
              );
    if ((this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != rows) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Array<double, -1, 1>, SrcXprType = Eigen::Array<double, -1, 1>, T1 = double, T2 = double]"
                   );
    }
  }
  pdVar4 = (this->array_x).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar14 = rows + 7;
  if (-1 < (long)rows) {
    uVar14 = rows;
  }
  uVar14 = uVar14 & 0xfffffffffffffff8;
  if (7 < (long)rows) {
    lVar15 = 0;
    do {
      pdVar1 = pdVar3 + lVar15;
      dVar5 = pdVar1[1];
      dVar6 = pdVar1[2];
      dVar7 = pdVar1[3];
      dVar8 = pdVar1[4];
      dVar9 = pdVar1[5];
      dVar10 = pdVar1[6];
      dVar11 = pdVar1[7];
      pdVar2 = pdVar4 + lVar15;
      *pdVar2 = *pdVar1;
      pdVar2[1] = dVar5;
      pdVar2[2] = dVar6;
      pdVar2[3] = dVar7;
      pdVar2[4] = dVar8;
      pdVar2[5] = dVar9;
      pdVar2[6] = dVar10;
      pdVar2[7] = dVar11;
      lVar15 = lVar15 + 8;
    } while (lVar15 < (long)uVar14);
  }
  if ((long)uVar14 < (long)rows) {
    do {
      pdVar4[uVar14] = pdVar3[uVar14];
      uVar14 = uVar14 + 1;
    } while (rows != uVar14);
  }
  return;
}

Assistant:

ChFunction_Integrate::ChFunction_Integrate(const ChFunction_Integrate& other) {
    fa = std::shared_ptr<ChFunction>(other.fa->Clone());
    order = other.order;
    C_start = other.C_start;
    x_start = other.x_start;
    x_end = other.x_end;
    num_samples = other.num_samples;
    array_x = other.array_x;
}